

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-ast.c
# Opt level: O1

ztast_scopearray_t * ztast_scopearray(ztast_t *ast,ztast_scopearrayinner_t *inner)

{
  ztast_scopearray_t *pzVar1;
  
  pzVar1 = (ztast_scopearray_t *)(*ast->mallocfn)(8,ast->opaque);
  if (pzVar1 == (ztast_scopearray_t *)0x0) {
    pzVar1 = (ztast_scopearray_t *)0x0;
  }
  else {
    pzVar1->inner = inner;
  }
  return pzVar1;
}

Assistant:

ztast_scopearray_t *ztast_scopearray(ztast_t                 *ast,
                                     ztast_scopearrayinner_t *inner)
{
  ztast_scopearray_t *scopearr;

  assert(ast);
  /* inner may be NULL */

#ifdef ZTAST_LOG
  if (ast->logfn)
    ast->logfn("ztast_scopearray\n");
#endif

  scopearr = ZTAST_MALLOC(sizeof(*scopearr));
  if (scopearr == NULL)
    return NULL;

  scopearr->inner = inner;

  return scopearr;
}